

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O0

void __thiscall
diy::detail::ReductionFunctor<void,_diy::RegularSwapPartners>::ReductionFunctor
          (ReductionFunctor<void,_diy::RegularSwapPartners> *this,int round_,Callback *reduce_,
          RegularSwapPartners *partners_,Assigner *assigner_)

{
  undefined4 in_ESI;
  RegularSwapPartners *in_RDI;
  pointer in_R8;
  pointer *ppiVar1;
  function<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>
  *in_stack_ffffffffffffffc8;
  function<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>
  *in_stack_ffffffffffffffd0;
  
  *(undefined4 *)
   &(in_RDI->super_RegularPartners).divisions_.super__Vector_base<int,_std::allocator<int>_>._M_impl
    .super__Vector_impl_data._M_start = in_ESI;
  ppiVar1 = &(in_RDI->super_RegularPartners).divisions_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  Catch::clara::std::
  function<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>::function
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  RegularSwapPartners::RegularSwapPartners(in_RDI,(RegularSwapPartners *)ppiVar1);
  in_RDI[1].super_RegularPartners.kvs_.
  super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = in_R8;
  return;
}

Assistant:

ReductionFunctor(int round_, const Callback& reduce_, const Partners& partners_, const Assigner& assigner_):
                    round(round_), reduce(reduce_), partners(partners_), assigner(assigner_)        {}